

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void max_w_cb(Fl_Value_Input *i,void *v)

{
  double dVar1;
  Fl_Type *pFVar2;
  bool bVar3;
  int iVar4;
  Fl_Type **ppFVar5;
  
  if ((char *)v == "LOAD") {
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar4 != 0) {
      Fl_Valuator::value(&i->super_Fl_Valuator,(double)*(int *)&current_widget[1].super_Fl_Type.next
                        );
      return;
    }
  }
  else {
    dVar1 = (i->super_Fl_Valuator).value_;
    bVar3 = false;
    ppFVar5 = &Fl_Type::first;
    while (pFVar2 = *ppFVar5, pFVar2 != (Fl_Type *)0x0) {
      if (pFVar2->selected != '\0') {
        iVar4 = (*pFVar2->_vptr_Fl_Type[0x21])(pFVar2);
        if (iVar4 != 0) {
          *(int *)&current_widget[1].super_Fl_Type.next = (int)dVar1;
          bVar3 = true;
        }
      }
      ppFVar5 = &pFVar2->next;
    }
    if (bVar3) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void max_w_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) return;
    i->value(((Fl_Window_Type*)current_widget)->sr_max_w);
  } else {
    int mod = 0;
    int n = (int)i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        ((Fl_Window_Type*)current_widget)->sr_max_w = n;
        mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}